

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerMessageDeflate.h
# Opt level: O0

string_view __thiscall
uWS::DeflationStream::deflate
          (DeflationStream *this,ZlibContext *zlibContext,string_view raw,bool reset)

{
  int iVar1;
  const_pointer pvVar2;
  size_type sVar3;
  long lVar4;
  char *__str;
  char *in_RSI;
  undefined8 *in_RDI;
  byte in_R8B;
  int err;
  int DEFLATE_OUTPUT_CHUNK;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  string_view local_10;
  
  std::__cxx11::string::clear();
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_20);
  *in_RDI = pvVar2;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_20);
  *(int *)(in_RDI + 1) = (int)sVar3;
  while( true ) {
    in_RDI[3] = *(undefined8 *)(in_RSI + 0x40);
    *(undefined4 *)(in_RDI + 4) = 0x4000;
    iVar1 = ::deflate(in_RDI,2);
    if ((iVar1 != 0) || (*(int *)(in_RDI + 4) != 0)) break;
    std::__cxx11::string::append(in_RSI,*(ulong *)(in_RSI + 0x40));
  }
  if ((in_R8B & 1) != 0) {
    deflateReset(in_RDI);
  }
  lVar4 = std::__cxx11::string::length();
  if (lVar4 == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_10,*(char **)(in_RSI + 0x40),(ulong)(0x3ffc - *(int *)(in_RDI + 4)));
  }
  else {
    std::__cxx11::string::append(in_RSI,*(ulong *)(in_RSI + 0x40));
    __str = (char *)std::__cxx11::string::data();
    lVar4 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_10,__str,lVar4 - 4);
  }
  return local_10;
}

Assistant:

std::string_view deflate(ZlibContext *zlibContext, std::string_view raw, bool reset) {
        /* Odd place to clear this one, fix */
        zlibContext->dynamicDeflationBuffer.clear();

        deflationStream.next_in = (Bytef *) raw.data();
        deflationStream.avail_in = (unsigned int) raw.length();

        /* This buffer size has to be at least 6 bytes for Z_SYNC_FLUSH to work */
        const int DEFLATE_OUTPUT_CHUNK = LARGE_BUFFER_SIZE;

        int err;
        do {
            deflationStream.next_out = (Bytef *) zlibContext->deflationBuffer;
            deflationStream.avail_out = DEFLATE_OUTPUT_CHUNK;

            err = ::deflate(&deflationStream, Z_SYNC_FLUSH);
            if (Z_OK == err && deflationStream.avail_out == 0) {
                zlibContext->dynamicDeflationBuffer.append(zlibContext->deflationBuffer, DEFLATE_OUTPUT_CHUNK - deflationStream.avail_out);
                continue;
            } else {
                break;
            }
        } while (true);

        /* This must not change avail_out */
        if (reset) {
            deflateReset(&deflationStream);
        }

        if (zlibContext->dynamicDeflationBuffer.length()) {
            zlibContext->dynamicDeflationBuffer.append(zlibContext->deflationBuffer, DEFLATE_OUTPUT_CHUNK - deflationStream.avail_out);

            return {(char *) zlibContext->dynamicDeflationBuffer.data(), zlibContext->dynamicDeflationBuffer.length() - 4};
        }

        return {
            zlibContext->deflationBuffer,
            DEFLATE_OUTPUT_CHUNK - deflationStream.avail_out - 4
        };
    }